

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * soul::Value::createFromRawData
                  (Value *__return_storage_ptr__,Type *type,void *sourceData,size_t dataSize)

{
  ArrayWithPreallocation<unsigned_char,_8UL> *this;
  Type local_38;
  
  local_38.category = type->category;
  local_38.arrayElementCategory = type->arrayElementCategory;
  local_38.isRef = type->isRef;
  local_38.isConstant = type->isConstant;
  local_38.primitiveType.type = (type->primitiveType).type;
  local_38.boundingSize = type->boundingSize;
  local_38.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_38.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  Value(__return_storage_ptr__,&local_38);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_38.structure.object);
  if ((__return_storage_ptr__->allocatedData).allocatedSize == dataSize) {
    this = &(__return_storage_ptr__->allocatedData).allocatedData;
    if ((__return_storage_ptr__->allocatedData).allocatedData.numActive == 0) {
      ArrayWithPreallocation<unsigned_char,_8UL>::resize(this,dataSize);
      dataSize = (__return_storage_ptr__->allocatedData).allocatedSize;
    }
    memcpy(this->items,sourceData,dataSize);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("dataSize == v.getPackedDataSize()","createFromRawData",0x217);
}

Assistant:

Value Value::createFromRawData (Type type, const void* sourceData, size_t dataSize)
{
    ignoreUnused (dataSize);

    Value v (std::move (type));
    SOUL_ASSERT (dataSize == v.getPackedDataSize());
    memcpy (v.getPackedData(), sourceData, v.getPackedDataSize());
    return v;
}